

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseTextDecl(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int oldstate;
  xmlChar *encoding;
  xmlChar *version;
  xmlParserCtxtPtr ctxt_local;
  
  if (((((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '<')) &&
         (ctxt->input->cur[1] == '?')) &&
        ((ctxt->input->cur[2] == 'x' && (ctxt->input->cur[3] == 'm')))) &&
       (ctxt->input->cur[4] == 'l')) ||
      (((ctxt->mlType == XML_TYPE_SML && (*ctxt->input->cur == '?')) &&
       ((ctxt->input->cur[1] == 'x' &&
        ((ctxt->input->cur[2] == 'm' && (ctxt->input->cur[3] == 'l')))))))) &&
     ((ctxt->input->cur[5] == ' ' ||
      (((8 < ctxt->input->cur[5] && (ctxt->input->cur[5] < 0xb)) || (ctxt->input->cur[5] == '\r'))))
     )) {
    iVar2 = 4;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar2 = 5;
    }
    ctxt->input->cur = ctxt->input->cur + iVar2;
    iVar2 = 4;
    if (ctxt->mlType == XML_TYPE_XML) {
      iVar2 = 5;
    }
    ctxt->input->col = iVar2 + ctxt->input->col;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    xVar1 = ctxt->instate;
    ctxt->instate = XML_PARSER_START;
    iVar2 = xmlSkipBlankChars(ctxt);
    if (iVar2 == 0) {
      xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed after \'<?xml\'\n");
    }
    encoding = xmlParseVersionInfo(ctxt);
    if (encoding == (xmlChar *)0x0) {
      encoding = xmlCharStrdup("1.0");
    }
    else {
      iVar2 = xmlSkipBlankChars(ctxt);
      if (iVar2 == 0) {
        xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space needed here\n");
      }
    }
    ctxt->input->version = encoding;
    pxVar3 = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == 0x20) {
      ctxt->instate = xVar1;
    }
    else {
      if ((pxVar3 == (xmlChar *)0x0) && (ctxt->errNo == 0)) {
        xmlFatalErrMsg(ctxt,XML_ERR_MISSING_ENCODING,"Missing encoding in text declaration\n");
      }
      xmlSkipBlankChars(ctxt);
      if ((((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '?')) &&
          (ctxt->input->cur[1] == '>')) ||
         ((ctxt->mlType == XML_TYPE_SML &&
          ((*ctxt->input->cur == '\n' || (*ctxt->input->cur == ';')))))) {
        ctxt->input->cur = ctxt->input->cur + 2;
        ctxt->input->col = ctxt->input->col + 2;
        if (*ctxt->input->cur == '\0') {
          xmlParserInputGrow(ctxt->input,0xfa);
        }
      }
      else if (((ctxt->mlType == XML_TYPE_XML) && (*ctxt->input->cur == '>')) ||
              ((ctxt->mlType == XML_TYPE_SML &&
               ((*ctxt->input->cur == '\n' || (*ctxt->input->cur == ';')))))) {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        xmlNextChar(ctxt);
      }
      else {
        xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_FINISHED,(char *)0x0);
        while( true ) {
          bVar4 = false;
          if (*ctxt->input->cur != '\0') {
            bVar4 = *ctxt->input->cur != '>';
          }
          if (!bVar4) break;
          ctxt->input->cur = ctxt->input->cur + 1;
        }
        xmlNextChar(ctxt);
      }
      ctxt->instate = xVar1;
    }
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_XMLDECL_NOT_STARTED,(char *)0x0);
  }
  return;
}

Assistant:

void
xmlParseTextDecl(xmlParserCtxtPtr ctxt) {
    xmlChar *version;
    const xmlChar *encoding;
    int oldstate;

    DEBUG_ENTER(("xmlParseTextDecl(%s);\n", dbgCtxt(ctxt)));

    /*
     * We know that '<?xml' is here.
     */
    if ((CMP5_MLI(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {
	SKIP_MLI(5);
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_STARTED, NULL);
	RETURN();
    }

    /* Avoid expansion of parameter entities when skipping blanks. */
    oldstate = ctxt->instate;
    ctxt->instate = XML_PARSER_START;

    if (SKIP_BLANKS == 0) {
	xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		       "Space needed after '<?xml'\n");
    }

    /*
     * We may have the VersionInfo here.
     */
    version = xmlParseVersionInfo(ctxt);
    if (version == NULL)
	version = xmlCharStrdup(XML_DEFAULT_VERSION);
    else {
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		           "Space needed here\n");
	}
    }
    ctxt->input->version = version;

    /*
     * We must have the encoding declaration
     */
    encoding = xmlParseEncodingDecl(ctxt);
    if (ctxt->errNo == XML_ERR_UNSUPPORTED_ENCODING) {
	/*
	 * The XML REC instructs us to stop parsing right here
	 */
        ctxt->instate = oldstate;
        RETURN();
    }
    if ((encoding == NULL) && (ctxt->errNo == XML_ERR_OK)) {
	xmlFatalErrMsg(ctxt, XML_ERR_MISSING_ENCODING,
		       "Missing encoding in text declaration\n");
    }

    SKIP_BLANKS;
    if (   (ISXML && (RAW == '?') && (NXT(1) == '>'))
        || (ISSML && ((RAW == '\n') || (RAW == ';')))) {
        SKIP(2);
    } else if (RAW_IS_GT_MLI) { /* RAW == '>' */
        /* Deprecated old WD ... */
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	NEXT;
    } else {
	xmlFatalErr(ctxt, XML_ERR_XMLDECL_NOT_FINISHED, NULL);
	MOVETO_ENDTAG(CUR_PTR);
	NEXT;
    }

    ctxt->instate = oldstate;
    RETURN();
}